

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O1

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (buffer != (char *)0x0) {
    if (value < 10000) {
      uVar2 = value / 100 + value / 100;
      if (999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar2];
        buffer = buffer + 1;
      }
      if (99 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
        buffer = buffer + 1;
      }
      uVar2 = (value % 100) * 2;
      if (9 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar2];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
      pcVar4 = buffer + 1;
    }
    else if (value < 100000000) {
      uVar2 = value / 500000 & 0xfffffffe;
      if (9999999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar2];
        buffer = buffer + 1;
      }
      uVar3 = (ulong)(((value % 10000) / 100) * 2);
      uVar1 = ((value % 10000) % 100) * 2;
      if (999999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
        buffer = buffer + 1;
      }
      uVar2 = (value / 10000 + (value / 1000000) * -100) * 2;
      if (99999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar2];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
      buffer[1] = GetDigitsLut()::cDigitsLut[uVar3];
      buffer[2] = GetDigitsLut()::cDigitsLut[uVar3 + 1];
      buffer[3] = GetDigitsLut()::cDigitsLut[uVar1];
      buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)uVar1 + 1];
      pcVar4 = buffer + 5;
    }
    else {
      uVar3 = (ulong)value / 100000000;
      uVar2 = value + (int)uVar3 * -100000000;
      if (value < 1000000000) {
        *buffer = (byte)((ulong)value / 100000000) | 0x30;
        pcVar4 = buffer + 1;
      }
      else {
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar3 * 2);
        pcVar4 = buffer + 2;
      }
      *(undefined2 *)pcVar4 =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar2 / 500000 & 0xfffffffe));
      *(undefined2 *)(pcVar4 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(uVar2 / 10000 + (uVar2 / 1000000) * -100) * 2);
      *(undefined2 *)(pcVar4 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((ulong)(uVar2 % 10000) / 100) * 2);
      *(undefined2 *)(pcVar4 + 6) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar2 % 10000) % 100) * 2);
      pcVar4 = pcVar4 + 8;
    }
    return pcVar4;
  }
  __assert_fail("buffer != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/internal/itoa.h"
                ,0x28,"char *rapidjson::internal::u32toa(uint32_t, char *)");
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);

    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;

        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];

        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal

        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;

        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}